

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableGcCompactSettings(void)

{
  ImChunkStream<ImGuiTableSettings> *this;
  int iVar1;
  ImGuiContext *pIVar2;
  ImGuiTableSettings *pIVar3;
  char *pcVar4;
  ImGuiTableSettings *__dest;
  int iVar5;
  ImChunkStream<ImGuiTableSettings> new_chunk_stream;
  ImVector<char> local_38;
  
  pIVar2 = GImGui;
  this = &GImGui->SettingsTables;
  pcVar4 = (GImGui->SettingsTables).Buf.Data;
  if (pcVar4 == (char *)0x0) {
    iVar5 = 0;
  }
  else {
    pIVar3 = (ImGuiTableSettings *)(pcVar4 + 4);
    iVar5 = 0;
    do {
      if (pIVar3->ID != 0) {
        iVar5 = iVar5 + pIVar3->ColumnsCount * 0xc + 0x10;
      }
      pIVar3 = ImChunkStream<ImGuiTableSettings>::next_chunk(this,pIVar3);
    } while (pIVar3 != (ImGuiTableSettings *)0x0);
  }
  if (iVar5 != (this->Buf).Size) {
    local_38.Size = 0;
    local_38.Capacity = 0;
    local_38.Data = (char *)0x0;
    if (0 < iVar5) {
      pcVar4 = (char *)MemAlloc((long)iVar5);
      if (local_38.Data != (char *)0x0) {
        memcpy(pcVar4,local_38.Data,(long)local_38.Size);
        MemFree(local_38.Data);
      }
      local_38.Capacity = iVar5;
      local_38.Data = pcVar4;
    }
    pcVar4 = (pIVar2->SettingsTables).Buf.Data;
    pIVar3 = (ImGuiTableSettings *)(pcVar4 + 4);
    if (pcVar4 == (char *)0x0) {
      pIVar3 = (ImGuiTableSettings *)0x0;
    }
    for (; pIVar3 != (ImGuiTableSettings *)0x0;
        pIVar3 = ImChunkStream<ImGuiTableSettings>::next_chunk(this,pIVar3)) {
      if (pIVar3->ID != 0) {
        __dest = ImChunkStream<ImGuiTableSettings>::alloc_chunk
                           ((ImChunkStream<ImGuiTableSettings> *)&local_38,
                            (long)pIVar3->ColumnsCount * 0xc + 0x10);
        memcpy(__dest,pIVar3,(long)pIVar3->ColumnsCount * 0xc + 0x10);
      }
    }
    iVar5 = (pIVar2->SettingsTables).Buf.Size;
    (pIVar2->SettingsTables).Buf.Size = local_38.Size;
    iVar1 = (pIVar2->SettingsTables).Buf.Capacity;
    (pIVar2->SettingsTables).Buf.Capacity = local_38.Capacity;
    local_38.Capacity = iVar1;
    local_38.Size = iVar5;
    pcVar4 = (pIVar2->SettingsTables).Buf.Data;
    (pIVar2->SettingsTables).Buf.Data = local_38.Data;
    if (pcVar4 != (char *)0x0) {
      local_38.Data = pcVar4;
      MemFree(pcVar4);
    }
  }
  return;
}

Assistant:

void ImGui::TableGcCompactSettings()
{
    ImGuiContext& g = *GImGui;
    int required_memory = 0;
    for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
        if (settings->ID != 0)
            required_memory += (int)TableSettingsCalcChunkSize(settings->ColumnsCount);
    if (required_memory == g.SettingsTables.Buf.Size)
        return;
    ImChunkStream<ImGuiTableSettings> new_chunk_stream;
    new_chunk_stream.Buf.reserve(required_memory);
    for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
        if (settings->ID != 0)
            memcpy(new_chunk_stream.alloc_chunk(TableSettingsCalcChunkSize(settings->ColumnsCount)), settings, TableSettingsCalcChunkSize(settings->ColumnsCount));
    g.SettingsTables.swap(new_chunk_stream);
}